

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O0

void __thiscall DatabaseException::DatabaseException(DatabaseException *this,string *reason)

{
  string *reason_local;
  DatabaseException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__DatabaseException_00244d60;
  std::__cxx11::string::string((string *)&this->reason,(string *)reason);
  return;
}

Assistant:

explicit DatabaseException(std::string reason): reason(reason) {}